

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlUTF8MultibyteLen(xmlParserCtxtPtr ctxt,xmlChar *str,char *errMsg)

{
  byte bVar1;
  byte bVar2;
  int c2;
  int c1;
  int c;
  char *errMsg_local;
  xmlChar *str_local;
  xmlParserCtxtPtr ctxt_local;
  
  bVar1 = *str;
  bVar2 = str[1];
  if ((bVar2 & 0xc0) == 0x80) {
    if (bVar1 < 0xe0) {
      if (0xc1 < bVar1) {
        return 2;
      }
    }
    else if ((str[2] & 0xc0) == 0x80) {
      if (bVar1 < 0xf0) {
        if (bVar1 == 0xe0) {
          if (bVar2 < 0xa0) goto LAB_0015119f;
        }
        else if (bVar1 == 0xed) {
          if (0x9f < bVar2) goto LAB_0015119f;
        }
        else if (((bVar1 == 0xef) && (bVar2 == 0xbf)) && (0xbd < str[2])) {
          xmlFatalErrMsg(ctxt,XML_ERR_INVALID_CHAR,errMsg);
        }
        return 3;
      }
      if ((str[3] & 0xc0) == 0x80) {
        if (bVar1 == 0xf0) {
          if (0x8f < bVar2) {
            return 4;
          }
        }
        else {
          if (bVar1 < 0xf4) {
            return 4;
          }
          if ((bVar1 < 0xf5) && (bVar2 < 0x90)) {
            return 4;
          }
        }
      }
    }
  }
LAB_0015119f:
  if ((ctxt->input->flags & 0x20U) == 0) {
    xmlCtxtErrIO(ctxt,0x51,(char *)0x0);
    ctxt->input->flags = ctxt->input->flags | 0x20;
  }
  return 0;
}

Assistant:

static int
xmlUTF8MultibyteLen(xmlParserCtxtPtr ctxt, const xmlChar *str,
                    const char *errMsg) {
    int c = str[0];
    int c1 = str[1];

    if ((c1 & 0xC0) != 0x80)
        goto encoding_error;

    if (c < 0xE0) {
        /* 2-byte sequence */
        if (c < 0xC2)
            goto encoding_error;

        return(2);
    } else {
        int c2 = str[2];

        if ((c2 & 0xC0) != 0x80)
            goto encoding_error;

        if (c < 0xF0) {
            /* 3-byte sequence */
            if (c == 0xE0) {
                /* overlong */
                if (c1 < 0xA0)
                    goto encoding_error;
            } else if (c == 0xED) {
                /* surrogate */
                if (c1 >= 0xA0)
                    goto encoding_error;
            } else if (c == 0xEF) {
                /* U+FFFE and U+FFFF are invalid Chars */
                if ((c1 == 0xBF) && (c2 >= 0xBE))
                    xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR, errMsg);
            }

            return(3);
        } else {
            /* 4-byte sequence */
            if ((str[3] & 0xC0) != 0x80)
                goto encoding_error;
            if (c == 0xF0) {
                /* overlong */
                if (c1 < 0x90)
                    goto encoding_error;
            } else if (c >= 0xF4) {
                /* greater than 0x10FFFF */
                if ((c > 0xF4) || (c1 >= 0x90))
                    goto encoding_error;
            }

            return(4);
        }
    }

encoding_error:
    /* Only report the first error */
    if ((ctxt->input->flags & XML_INPUT_ENCODING_ERROR) == 0) {
        xmlCtxtErrIO(ctxt, XML_ERR_INVALID_ENCODING, NULL);
        ctxt->input->flags |= XML_INPUT_ENCODING_ERROR;
    }

    return(0);
}